

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlSetEntityLoader(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_30;
  PyObject *loader;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:libxml_xmlSetEntityLoader",&local_30);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = PyCallable_Check(local_30);
    if (iVar1 == 0) {
      PyErr_SetString(_PyExc_ValueError,"entity loader is not callable");
      self_local = (PyObject *)0x0;
    }
    else {
      if (defaultExternalEntityLoader == (xmlExternalEntityLoader)0x0) {
        defaultExternalEntityLoader = (xmlExternalEntityLoader)xmlGetExternalEntityLoader();
      }
      _Py_XDECREF(pythonExternalEntityLoaderObjext);
      pythonExternalEntityLoaderObjext = local_30;
      _Py_XINCREF(local_30);
      xmlSetExternalEntityLoader(pythonExternalEntityLoader);
      self_local = (PyObject *)PyLong_FromLong(0);
    }
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlSetEntityLoader(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    PyObject *py_retval;
    PyObject *loader;

    if (!PyArg_ParseTuple(args, (char *)"O:libxml_xmlSetEntityLoader",
		&loader))
	return(NULL);

    if (!PyCallable_Check(loader)) {
	PyErr_SetString(PyExc_ValueError, "entity loader is not callable");
	return(NULL);
    }

    if (defaultExternalEntityLoader == NULL) 
	defaultExternalEntityLoader = xmlGetExternalEntityLoader();

    Py_XDECREF(pythonExternalEntityLoaderObjext);
    pythonExternalEntityLoaderObjext = loader;
    Py_XINCREF(pythonExternalEntityLoaderObjext);
    xmlSetExternalEntityLoader(pythonExternalEntityLoader);

    py_retval = PyLong_FromLong(0);
    return(py_retval);
}